

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdio.cpp
# Opt level: O0

SQRESULT sqstd_loadfile(HSQUIRRELVM v,SQChar *filename,SQBool printerror)

{
  uint uVar1;
  SQFILE pvVar2;
  SQInteger SVar3;
  SQRESULT SVar4;
  IOBuffer buffer;
  SQLEXREADFUNC func;
  uchar uc;
  unsigned_short us;
  SQInteger ret;
  SQFILE file;
  SQChar *in_stack_fffffffffffff798;
  undefined4 in_stack_fffffffffffff7a0;
  undefined4 in_stack_fffffffffffff7a4;
  SQInteger in_stack_fffffffffffff7a8;
  void *in_stack_fffffffffffff7b0;
  SQFILE in_stack_fffffffffffff7b8;
  SQUserPointer in_stack_fffffffffffff7d8;
  SQREADFUNC in_stack_fffffffffffff7e0;
  HSQUIRRELVM in_stack_fffffffffffff7e8;
  SQBool in_stack_fffffffffffff808;
  SQChar *in_stack_fffffffffffff810;
  SQUserPointer in_stack_fffffffffffff818;
  SQLEXREADFUNC in_stack_fffffffffffff820;
  HSQUIRRELVM in_stack_fffffffffffff828;
  char local_33;
  ushort local_32;
  
  pvVar2 = sqstd_fopen((SQChar *)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                       in_stack_fffffffffffff798);
  if (pvVar2 == (SQFILE)0x0) {
    SVar4 = sq_throwerror((HSQUIRRELVM)CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0)
                          ,in_stack_fffffffffffff798);
    return SVar4;
  }
  SVar3 = sqstd_fread(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8,
                      CONCAT44(in_stack_fffffffffffff7a4,in_stack_fffffffffffff7a0),
                      in_stack_fffffffffffff798);
  if (SVar3 != 2) {
    local_32 = 0;
  }
  if (local_32 == 0xfafa) {
    sqstd_fseek(in_stack_fffffffffffff7b8,(SQInteger)in_stack_fffffffffffff7b0,
                in_stack_fffffffffffff7a8);
    SVar4 = sq_readclosure(in_stack_fffffffffffff7e8,in_stack_fffffffffffff7e0,
                           in_stack_fffffffffffff7d8);
    if (-1 < SVar4) {
      sqstd_fclose((SQFILE)0x14cae9);
      return 0;
    }
  }
  else {
    uVar1 = (uint)local_32;
    if (uVar1 == 0xbbef) {
      SVar3 = sqstd_fread(in_stack_fffffffffffff7b0,in_stack_fffffffffffff7a8,
                          (ulong)CONCAT24(local_32,in_stack_fffffffffffff7a0),
                          in_stack_fffffffffffff798);
      if (SVar3 == 0) {
        sqstd_fclose((SQFILE)0x14cb8a);
        SVar4 = sq_throwerror((HSQUIRRELVM)CONCAT44(uVar1,in_stack_fffffffffffff7a0),
                              in_stack_fffffffffffff798);
        return SVar4;
      }
      if (local_33 != -0x41) {
        sqstd_fclose((SQFILE)0x14cbc7);
        SVar4 = sq_throwerror((HSQUIRRELVM)CONCAT44(uVar1,in_stack_fffffffffffff7a0),
                              in_stack_fffffffffffff798);
        return SVar4;
      }
    }
    else if ((uVar1 != 0xfeff) && (uVar1 != 0xfffe)) {
      sqstd_fseek(in_stack_fffffffffffff7b8,(SQInteger)in_stack_fffffffffffff7b0,
                  in_stack_fffffffffffff7a8);
    }
    SVar4 = sq_compile(in_stack_fffffffffffff828,in_stack_fffffffffffff820,in_stack_fffffffffffff818
                       ,in_stack_fffffffffffff810,in_stack_fffffffffffff808);
    if (-1 < SVar4) {
      sqstd_fclose((SQFILE)0x14cc74);
      return 0;
    }
  }
  sqstd_fclose((SQFILE)0x14cc91);
  return -1;
}

Assistant:

SQRESULT sqstd_loadfile(HSQUIRRELVM v,const SQChar *filename,SQBool printerror)
{
    SQFILE file = sqstd_fopen(filename,_SC("rb"));

    SQInteger ret;
    unsigned short us;
    unsigned char uc;
    SQLEXREADFUNC func = _io_file_lexfeed_PLAIN;
    if(file){
        ret = sqstd_fread(&us,1,2,file);
        if(ret != 2) {
            //probably an empty file
            us = 0;
        }
        if(us == SQ_BYTECODE_STREAM_TAG) { //BYTECODE
            sqstd_fseek(file,0,SQ_SEEK_SET);
            if(SQ_SUCCEEDED(sq_readclosure(v,file_read,file))) {
                sqstd_fclose(file);
                return SQ_OK;
            }
        }
        else { //SCRIPT

            switch(us)
            {
                //gotta swap the next 2 lines on BIG endian machines
                case 0xFFFE: func = _io_file_lexfeed_UCS2_BE; break;//UTF-16 little endian;
                case 0xFEFF: func = _io_file_lexfeed_UCS2_LE; break;//UTF-16 big endian;
                case 0xBBEF:
                    if(sqstd_fread(&uc,1,sizeof(uc),file) == 0) {
                        sqstd_fclose(file);
                        return sq_throwerror(v,_SC("io error"));
                    }
                    if(uc != 0xBF) {
                        sqstd_fclose(file);
                        return sq_throwerror(v,_SC("Unrecognized encoding"));
                    }
#ifdef SQUNICODE
                    func = _io_file_lexfeed_UTF8;
#else
                    func = _io_file_lexfeed_PLAIN;
#endif
                    break;//UTF-8 ;
                default: sqstd_fseek(file,0,SQ_SEEK_SET); break; // ascii
            }
            IOBuffer buffer;
            buffer.ptr = 0;
            buffer.size = 0;
            buffer.file = file;
            if(SQ_SUCCEEDED(sq_compile(v,func,&buffer,filename,printerror))){
                sqstd_fclose(file);
                return SQ_OK;
            }
        }
        sqstd_fclose(file);
        return SQ_ERROR;
    }
    return sq_throwerror(v,_SC("cannot open the file"));
}